

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O3

void __thiscall
ft::list<int,ft::allocator<int>>::mergeSort<ft::less<int>>
          (list<int,ft::allocator<int>> *this,list<int,_ft::allocator<int>_> *first)

{
  node *pnVar1;
  list<int,_ft::allocator<int>_> local_50;
  
  if (1 < first->m_size) {
    local_50.m_size = 0;
    pnVar1 = (node *)operator_new(0x18);
    local_50.m_head = pnVar1;
    local_50.m_tail = (node *)operator_new(0x18);
    pnVar1->data = 0;
    pnVar1->prev = (listNode<int> *)0x0;
    (local_50.m_tail)->data = 0;
    (local_50.m_tail)->next = (listNode<int> *)0x0;
    pnVar1->next = local_50.m_tail;
    (local_50.m_tail)->prev = pnVar1;
    list<int,_ft::allocator<int>_>::split((list<int,_ft::allocator<int>_> *)this,first,&local_50);
    mergeSort<ft::less<int>>(this,first);
    mergeSort<ft::less<int>>(this,&local_50);
    merge<ft::less<int>>(first,&local_50);
    list<int,_ft::allocator<int>_>::~list(&local_50);
  }
  return;
}

Assistant:

void mergeSort(list & first, Compare comp) {
		if (first.size() > 1) {
			list	second;
			this->split(first, second);

			this->mergeSort(first, comp);
			this->mergeSort(second, comp);

			first.merge(second, comp);
		}
	}